

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_byteStream_primitive_nextPut
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sysbvm_byteStream_nextPut(context,*arguments,(uint8_t)((uint)arguments[1] >> 4));
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_byteStream_primitive_nextPut(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_byteStream_nextPut(context, arguments[0], sysbvm_tuple_char8_decode(arguments[1]));
    return SYSBVM_VOID_TUPLE;
}